

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O3

bool __thiscall
wasm::SimplifyLocals<false,_false,_false>::runLateOptimizations
          (SimplifyLocals<false,_false,_false> *this,Function *func)

{
  PassRunner *pPVar1;
  Module *pMVar2;
  long lVar3;
  PassOptions *pPVar4;
  undefined8 *puVar5;
  byte bVar6;
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_> local_388;
  undefined1 uStack_2b0;
  undefined1 local_2af;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_2a8;
  undefined1 local_2a0;
  undefined2 local_298;
  undefined1 local_296;
  undefined8 local_294;
  undefined8 uStack_28c;
  undefined4 local_284;
  undefined1 local_280;
  undefined5 local_27c;
  undefined3 uStack_277;
  undefined5 uStack_274;
  undefined1 local_260;
  undefined1 local_258;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_250;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_218;
  undefined2 local_1e0;
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_1d8;
  undefined1 local_198 [8];
  UnneededSetRemover setRemover;
  pointer local_90;
  pointer local_80;
  _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_68;
  
  bVar6 = 0;
  LocalGetCounter::analyze(&this->getCounter,func,func->body);
  local_388.replacep = (Expression **)0x0;
  local_388.stack.usedFixed = 0;
  local_388.stack.flexible.
  super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_388.stack.flexible.
  super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_388.stack.flexible.
  super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_388.currFunction._0_1_ = 0;
  local_388.currFunction._1_7_ = 0;
  local_388.currModule._0_1_ = 0;
  local_388.currModule._1_7_ = 0;
  uStack_2b0 = 0;
  local_2af = 1;
  local_298 = 0x100;
  local_296 = 1;
  local_294 = 0;
  uStack_28c = 0xffffffff00000002;
  local_284 = 0x14;
  local_280 = 0;
  local_260 = 0;
  local_250._M_buckets = &local_250._M_single_bucket;
  local_27c = 0;
  uStack_277 = 0;
  uStack_274 = 0;
  local_250._M_bucket_count = 1;
  local_250._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_250._M_element_count = 0;
  local_250._M_rehash_policy._M_max_load_factor = 1.0;
  local_250._M_rehash_policy._M_next_resize = 0;
  local_250._M_single_bucket = (__node_base_ptr)0x0;
  local_218._M_buckets = &local_218._M_single_bucket;
  local_218._M_bucket_count = 1;
  local_218._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_218._M_element_count = 0;
  local_218._M_rehash_policy._M_max_load_factor = 1.0;
  local_1d8._M_buckets = &local_1d8._M_single_bucket;
  local_218._M_rehash_policy._M_next_resize = 0;
  local_218._M_single_bucket = (__node_base_ptr)0x0;
  local_1e0 = 0;
  local_1d8._M_bucket_count = 1;
  local_1d8._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_1d8._M_element_count = 0;
  local_1d8._M_rehash_policy._M_max_load_factor = 1.0;
  local_1d8._M_rehash_policy._M_next_resize = 0;
  local_1d8._M_single_bucket = (__node_base_ptr)0x0;
  pPVar1 = (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
           ).super_Pass.runner;
  pPVar4 = &pPVar1->options;
  puVar5 = (undefined8 *)&local_298;
  for (lVar3 = 8; lVar3 != 0; lVar3 = lVar3 + -1) {
    *puVar5 = *(undefined8 *)pPVar4;
    pPVar4 = (PassOptions *)((long)pPVar4 + (ulong)bVar6 * -0x10 + 8);
    puVar5 = puVar5 + (ulong)bVar6 * -2 + 1;
  }
  local_258 = (pPVar1->options).targetJS;
  if (&pPVar1->options != (PassOptions *)&local_298) {
    std::
    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                *)&local_250,&(pPVar1->options).arguments._M_h);
    std::
    _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
    ::
    _M_assign_elements<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&>
              ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                *)&local_218,&(pPVar1->options).passesToSkip._M_h);
  }
  local_2a8 = &(this->getCounter).num;
  local_2a0 = 0;
  pMVar2 = (this->
           super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
           ).
           super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
           .
           super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
           .
           super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
           .currModule;
  local_388.currModule._0_1_ = SUB81(pMVar2,0);
  local_388.currModule._1_7_ = (undefined7)((ulong)pMVar2 >> 8);
  local_388.currFunction._0_1_ = SUB81(func,0);
  local_388.currFunction._1_7_ = (undefined7)((ulong)func >> 8);
  Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::walk
            (&local_388,&func->body);
  local_388.currFunction._0_1_ = 0;
  local_388.currFunction._1_7_ = 0;
  local_388.currModule._0_1_ = 0;
  local_388.currModule._1_7_ = 0;
  if (local_1e0._1_1_ == '\x01') {
    ReFinalize::ReFinalize((ReFinalize *)local_198);
    Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_>::walk
              ((Walker<wasm::ReFinalize,_wasm::OverriddenVisitor<wasm::ReFinalize,_void>_> *)
               (setRemover.
                super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                .
                super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                .stack.fixed._M_elems + 4),&func->body);
    local_198 = (undefined1  [8])&PTR__ReFinalize_01070c30;
    std::
    _Hashtable<wasm::Name,_std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>,_std::allocator<std::pair<const_wasm::Name,_std::unordered_set<wasm::Type,_std::hash<wasm::Type>,_std::equal_to<wasm::Type>,_std::allocator<wasm::Type>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::Name>,_std::hash<wasm::Name>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_68);
    if (local_90 != (pointer)0x0) {
      operator_delete(local_90,(long)local_80 - (long)local_90);
    }
    Pass::~Pass((Pass *)local_198);
  }
  UnneededSetRemover::UnneededSetRemover
            ((UnneededSetRemover *)local_198,&this->getCounter,func,
             &((this->
               super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
               ).super_Pass.runner)->options,
             (this->
             super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
             ).
             super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .
             super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .
             super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
             .currModule);
  setRemover.
  super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.
  super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.
  currFunction = (Function *)
                 (this->
                 super_WalkerPass<wasm::LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>_>
                 ).
                 super_LinearExecutionWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .
                 super_PostWalker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .
                 super_Walker<wasm::SimplifyLocals<false,_false,_false>,_wasm::Visitor<wasm::SimplifyLocals<false,_false,_false>,_void>_>
                 .currModule;
  bVar6 = (byte)local_1e0;
  if (setRemover.
      super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.
      super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>.stack.
      fixed._M_elems[9].currp != (Expression **)0x0) {
    operator_delete(setRemover.
                    super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                    .
                    super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                    .stack.fixed._M_elems[9].currp,
                    (long)setRemover.
                          super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                          .
                          super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                          .stack.flexible.
                          super__Vector_base<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task,_std::allocator<wasm::Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)setRemover.
                          super_PostWalker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                          .
                          super_Walker<wasm::UnneededSetRemover,_wasm::Visitor<wasm::UnneededSetRemover,_void>_>
                          .stack.fixed._M_elems[9].currp);
  }
  std::
  _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::shared_ptr<std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_1d8);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_218);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&local_250);
  if (local_388.stack.flexible.
      super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_388.stack.flexible.
                    super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_388.stack.flexible.
                          super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_388.stack.flexible.
                          super__Vector_base<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task,_std::allocator<wasm::Walker<EquivalentOptimizer,_wasm::Visitor<EquivalentOptimizer,_void>_>::Task>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (bool)((bVar6 | (byte)setRemover.module) & 1);
}

Assistant:

bool runLateOptimizations(Function* func) {
    // Finally, after optimizing a function we can do some additional
    // optimization.
    getCounter.analyze(func);
    // Remove equivalent copies - assignment of
    // a local to another local that already contains that value. Note that
    // we do that at the very end, and only after structure, as removing
    // the copy here:
    //   (if
    //    (local.get $var$0)
    //    (local.set $var$0
    //     (local.get $var$0)
    //    )
    //    (local.set $var$0
    //     (i32.const 208)
    //    )
    //   )
    // will inhibit us creating an if return value.
    struct EquivalentOptimizer
      : public LinearExecutionWalker<EquivalentOptimizer> {

      // It is ok to look at adjacent blocks together, as if a later part of a
      // block is not reached that is fine - changes we make there would not be
      // reached in that case.
      bool connectAdjacentBlocks = true;

      std::vector<Index>* numLocalGets;
      bool removeEquivalentSets;
      PassOptions passOptions;

      bool anotherCycle = false;
      bool refinalize = false;

      // We track locals containing the same value.
      EquivalentSets equivalences;

      static void doNoteNonLinear(EquivalentOptimizer* self,
                                  Expression** currp) {
        // TODO do this across non-linear paths too, in coalesce-locals perhaps?
        //      (would inhibit structure opts here, though.
        self->equivalences.clear();
      }

      void visitLocalSet(LocalSet* curr) {
        auto* module = this->getModule();

        // Remove trivial copies, even through a tee
        auto* value =
          Properties::getFallthrough(curr->value, passOptions, *module);
        if (auto* get = value->template dynCast<LocalGet>()) {
          if (equivalences.check(curr->index, get->index)) {
            // This is an unnecessary copy!
            if (removeEquivalentSets) {
              if (curr->isTee()) {
                if (curr->value->type != curr->type) {
                  refinalize = true;
                }
                this->replaceCurrent(curr->value);
              } else {
                this->replaceCurrent(Builder(*module).makeDrop(curr->value));
              }
              anotherCycle = true;
            }
            // Nothing more to do, ignore the copy.
            return;
          } else {
            // There is a new equivalence now. Remove all the old ones, and add
            // the new one.
            equivalences.reset(curr->index);
            equivalences.add(curr->index, get->index);
            return;
          }
        }
        // A new value of some kind is assigned here, and it's not something we
        // could handle earlier, so remove all the old equivalent ones.
        equivalences.reset(curr->index);
      }

      void visitLocalGet(LocalGet* curr) {
        // Canonicalize gets: if some are equivalent, then we can pick more
        // then one, and other passes may benefit from having more uniformity.
        if (auto* set = equivalences.getEquivalents(curr->index)) {
          // Helper method that returns the # of gets *ignoring the current
          // get*, as we want to see what is best overall, treating this one as
          // to be decided upon.
          auto getNumGetsIgnoringCurr = [&](Index index) {
            auto ret = (*numLocalGets)[index];
            if (index == curr->index) {
              assert(ret >= 1);
              ret--;
            }
            return ret;
          };

          // Pick the index with the most uses - maximizing the chance to
          // lower one's uses to zero. If types differ though then we prefer to
          // switch to a more refined type even if there are fewer uses, as that
          // may have significant benefits to later optimizations (we may be
          // able to use it to remove casts, etc.).
          auto* func = this->getFunction();
          Index best = -1;
          for (auto index : *set) {
            if (best == Index(-1)) {
              // This is the first possible option we've seen.
              best = index;
              continue;
            }

            auto bestType = func->getLocalType(best);
            auto addressType = func->getLocalType(index);
            if (!Type::isSubType(addressType, bestType)) {
              // This is less refined than the current best; ignore.
              continue;
            }

            // This is better if it has a more refined type, or if it has more
            // uses.
            if (addressType != bestType ||
                getNumGetsIgnoringCurr(index) > getNumGetsIgnoringCurr(best)) {
              best = index;
            }
          }
          assert(best != Index(-1));
          // Due to ordering, the best index may be different from us but have
          // the same # of locals - make sure we actually improve, either adding
          // more gets, or a more refined type (and never change to a less
          // refined type).
          auto bestType = func->getLocalType(best);
          auto oldType = func->getLocalType(curr->index);
          if (best != curr->index && Type::isSubType(bestType, oldType)) {
            auto hasMoreGets = getNumGetsIgnoringCurr(best) >
                               getNumGetsIgnoringCurr(curr->index);
            if (hasMoreGets || bestType != oldType) {
              // Update the get counts.
              (*numLocalGets)[best]++;
              assert((*numLocalGets)[curr->index] >= 1);
              (*numLocalGets)[curr->index]--;
              // Make the change.
              curr->index = best;
              anotherCycle = true;
              if (bestType != oldType) {
                curr->type = func->getLocalType(best);
                // We are switching to a more refined type, which might require
                // changes in the user of the local.get.
                refinalize = true;
              }
            }
          }
        }
      }
    };

    EquivalentOptimizer eqOpter;
    eqOpter.passOptions = this->getPassOptions();
    eqOpter.numLocalGets = &getCounter.num;
    eqOpter.removeEquivalentSets = allowStructure;
    eqOpter.walkFunctionInModule(func, this->getModule());
    if (eqOpter.refinalize) {
      ReFinalize().walkFunctionInModule(func, this->getModule());
    }

    // We may have already had a local with no uses, or we may have just
    // gotten there thanks to the EquivalentOptimizer. If there are such
    // locals, remove all their sets.
    UnneededSetRemover setRemover(
      getCounter, func, this->getPassOptions(), *this->getModule());
    setRemover.setModule(this->getModule());

    return eqOpter.anotherCycle || setRemover.removed;
  }